

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::FeatureResolverTest_MergeFeaturesDistantPast_Test::TestBody
          (FeatureResolverTest_MergeFeaturesDistantPast_Test *this)

{
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *gmock_p0;
  HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *matcher;
  char *message;
  AssertionResult gtest_ar;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1 local_e0 [11];
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  testing::HasSubstr<char[20]>(&local_140,(StringLike<char[20]> *)"Edition 1_TEST_ONLY");
  testing::HasSubstr<char[31]>(&local_160,(StringLike<char[31]> *)"minimum supported edition 2023");
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Tuple_impl(&local_88,&local_140,&local_160);
  protobuf::(anonymous_namespace)::
  HasError<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>
            ((HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_48,(_anonymous_namespace_ *)&local_88,gmock_p0);
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
            ((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)&local_120,(internal *)&local_48,matcher);
  SetupFeatureResolver<>
            ((StatusOr<google::protobuf::FeatureResolver> *)&local_e0[0].status_,EDITION_1_TEST_ONLY
            );
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::HasErrorMatcherP<testing::internal::VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>,testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>>>
  ::operator()(&gtest_ar,(char *)&local_120,
               (StatusOr<google::protobuf::FeatureResolver> *)
               "SetupFeatureResolver(EDITION_1_TEST_ONLY)");
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureResolver> *)&local_e0[0].status_);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Tuple_impl(&local_120);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Tuple_impl(&local_48);
  std::
  _Tuple_impl<0UL,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Tuple_impl(&local_88);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0[0].status_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
               ,0x22b,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_120,(Message *)&local_e0[0].status_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if (local_e0[0] !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureResolver>_1)0x0) {
      (**(code **)(*(long *)local_e0[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FeatureResolverTest, MergeFeaturesDistantPast) {
  EXPECT_THAT(SetupFeatureResolver(EDITION_1_TEST_ONLY),
              HasError(AllOf(HasSubstr("Edition 1_TEST_ONLY"),
                             HasSubstr("minimum supported edition 2023"))));
}